

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::EqualTest<unsigned_short,unsigned_long>(void)

{
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_3a;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_38;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_36;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_34;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_32;
  int local_30 [6];
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_18;
  
  local_30[5] = 3;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_32,local_30 + 5);
  if (local_32.m_int == 2) {
    local_30[4] = 4;
    SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              (&local_34,local_30 + 4);
    if (local_34.m_int == 5) {
      local_30[3] = 6;
      SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_36,local_30 + 3);
      local_30[2] = 7;
      SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_18,local_30 + 2);
      if (local_18.m_int == local_36.m_int) {
        local_30[1] = 1;
        SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                  (&local_38,local_30 + 1);
        if (local_38.m_int != 0) {
          local_30[0] = 0;
          SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::
          SafeInt<int>(&local_3a,local_30);
          return local_3a.m_int == 0;
        }
      }
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool EqualTest()
	{
		return
			(U)2 == SafeInt<T>(3) &&
			SafeInt<T>(4) == (U)5 &&
			SafeInt<T>(6) == SafeInt<U>(7) &&
			true == SafeInt<T>(1) &&
			false == SafeInt<T>(0);
	}